

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_dofhandler.cc
# Opt level: O3

size_type __thiscall
projects::dpg::ProductUniformFEDofHandler::NumInteriorDofs
          (ProductUniformFEDofHandler *this,Entity *entity)

{
  element_type *peVar1;
  pointer pvVar2;
  int iVar3;
  dim_t dVar4;
  uint uVar5;
  
  iVar3 = (*entity->_vptr_Entity[4])(entity);
  dVar4 = lf::base::internal::DimensionImpl((RefElType)iVar3);
  peVar1 = (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar5 = (*peVar1->_vptr_Mesh[5])(peVar1,entity);
  pvVar2 = (this->internal_dofs_)._M_elems[2 - dVar4].
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (size_type)
         ((ulong)((long)pvVar2[uVar5].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 *(long *)&pvVar2[uVar5].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data) >> 3);
}

Assistant:

size_type ProductUniformFEDofHandler::NumInteriorDofs(
    const lf::mesh::Entity& entity) const {
  const dim_t codim = 2 - entity.RefEl().Dimension();
  const glb_idx_t entity_idx = mesh_p_->Index(entity);
  const size_type num_dofs = internal_dofs_[codim][entity_idx].size();
  return num_dofs;
}